

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

size_t * Catch::anon_unknown_26::findMax(size_t *i,size_t *j,size_t *k,size_t *l)

{
  size_t *l_local;
  size_t *k_local;
  size_t *j_local;
  size_t *i_local;
  size_t *local_8;
  
  if ((((*i <= *j) || (*i <= *k)) || (local_8 = i, *i <= *l)) &&
     (((*j <= *k || (local_8 = j, *j <= *l)) && (local_8 = l, *l < *k)))) {
    local_8 = k;
  }
  return local_8;
}

Assistant:

std::size_t&
findMax( std::size_t& i, std::size_t& j, std::size_t& k, std::size_t& l ) {
    if (i > j && i > k && i > l)
        return i;
    else if (j > k && j > l)
        return j;
    else if (k > l)
        return k;
    else
        return l;
}